

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallSubdirectoryGenerator.cxx
# Opt level: O0

bool __thiscall cmInstallSubdirectoryGenerator::HaveInstall(cmInstallSubdirectoryGenerator *this)

{
  bool bVar1;
  uint uVar2;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *this_00;
  reference ppcVar3;
  cmInstallGenerator *generator;
  iterator __end1;
  iterator __begin1;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *__range1;
  cmInstallSubdirectoryGenerator *this_local;
  
  this_00 = cmMakefile::GetInstallGenerators(this->Makefile);
  __end1 = std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::begin(this_00);
  generator = (cmInstallGenerator *)
              std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::end(this_00)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmInstallGenerator_**,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
                                *)&generator);
    if (!bVar1) {
      return false;
    }
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmInstallGenerator_**,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
              ::operator*(&__end1);
    uVar2 = (*((*ppcVar3)->super_cmScriptGenerator)._vptr_cmScriptGenerator[8])();
    if ((uVar2 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<cmInstallGenerator_**,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
    ::operator++(&__end1);
  }
  return true;
}

Assistant:

bool cmInstallSubdirectoryGenerator::HaveInstall()
{
  for (auto generator : this->Makefile->GetInstallGenerators()) {
    if (generator->HaveInstall()) {
      return true;
    }
  }

  return false;
}